

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

int __thiscall libtorrent::aux::udp_socket::close(udp_socket *this,int __fd)

{
  socks5 *this_00;
  int iVar1;
  int extraout_EAX;
  int __fd_00;
  error_code ec;
  undefined4 local_20;
  undefined1 local_1c;
  system_error_category *local_18;
  
  local_20 = 0;
  local_1c = 0;
  local_18 = &boost::system::detail::cat_holder<void>::system_category_instance;
  __fd_00 = (int)&local_20;
  iVar1 = boost::asio::
          basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::close((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)this,__fd_00);
  this_00 = (this->m_socks5_connection).
            super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (socks5 *)0x0) {
    socks5::close(this_00,__fd_00);
    ::std::__shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_socks5_connection).
                super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>);
    iVar1 = extraout_EAX;
  }
  this->field_0xf0 = this->field_0xf0 | 1;
  return iVar1;
}

Assistant:

void udp_socket::close()
{
	TORRENT_ASSERT(is_single_thread());

	error_code ec;
	m_socket.close(ec);
	TORRENT_ASSERT_VAL(!ec || ec == error::bad_descriptor, ec);
	if (m_socks5_connection)
	{
		m_socks5_connection->close();
		m_socks5_connection.reset();
	}
	m_abort = true;
}